

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

DdHashTable * cuddHashTableInit(DdManager *manager,uint keySize,uint initSize)

{
  int iVar1;
  DdNode *pDVar2;
  int logSize;
  DdHashTable *hash;
  uint initSize_local;
  uint keySize_local;
  DdManager *manager_local;
  
  manager_local = (DdManager *)malloc(0x38);
  if (manager_local == (DdManager *)0x0) {
    manager->errorCode = CUDD_MEMORY_OUT;
    manager_local = (DdManager *)0x0;
  }
  else {
    (manager_local->sentinel).index = keySize;
    manager_local->zero = &manager->sentinel;
    (manager_local->sentinel).type.kids.E = (DdNode *)0x0;
    (manager_local->sentinel).type.value = 0.0;
    (manager_local->sentinel).ref = (keySize + 1) * 8 + 0x10;
    hash._0_4_ = initSize;
    if (initSize < 2) {
      hash._0_4_ = 2;
    }
    iVar1 = cuddComputeFloorLog2((uint)hash);
    *(int *)&(manager_local->sentinel).Id = 1 << ((byte)iVar1 & 0x1f);
    *(int *)((long)&(manager_local->sentinel).Id + 4) = 0x20 - iVar1;
    pDVar2 = (DdNode *)malloc((ulong)(uint)(manager_local->sentinel).Id << 3);
    (manager_local->sentinel).next = pDVar2;
    if ((manager_local->sentinel).next == (DdNode *)0x0) {
      manager->errorCode = CUDD_MEMORY_OUT;
      if (manager_local != (DdManager *)0x0) {
        free(manager_local);
      }
      manager_local = (DdManager *)0x0;
    }
    else {
      memset((manager_local->sentinel).next,0,(ulong)(uint)(manager_local->sentinel).Id << 3);
      *(undefined4 *)&manager_local->one = 0;
      *(int *)((long)&manager_local->one + 4) = (int)(manager_local->sentinel).Id << 1;
    }
  }
  return (DdHashTable *)manager_local;
}

Assistant:

DdHashTable *
cuddHashTableInit(
  DdManager * manager,
  unsigned int  keySize,
  unsigned int  initSize)
{
    DdHashTable *hash;
    int logSize;

#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    hash = ABC_ALLOC(DdHashTable, 1);
    if (hash == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    hash->keysize = keySize;
    hash->manager = manager;
    hash->memoryList = NULL;
    hash->nextFree = NULL;
    hash->itemsize = (keySize + 1) * sizeof(DdNode *) +
        sizeof(ptrint) + sizeof(DdHashItem *);
    /* We have to guarantee that the shift be < 32. */
    if (initSize < 2) initSize = 2;
    logSize = cuddComputeFloorLog2(initSize);
    hash->numBuckets = 1 << logSize;
    hash->shift = sizeof(int) * 8 - logSize;
    hash->bucket = ABC_ALLOC(DdHashItem *, hash->numBuckets);
    if (hash->bucket == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(hash);
        return(NULL);
    }
    memset(hash->bucket, 0, hash->numBuckets * sizeof(DdHashItem *));
    hash->size = 0;
    hash->maxsize = hash->numBuckets * DD_MAX_HASHTABLE_DENSITY;
#ifdef __osf__
#pragma pointer_size restore
#endif
    return(hash);

}